

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_Tag.cpp
# Opt level: O1

ostream * psy::C::operator<<(ostream *os,TagType *tagTy)

{
  long lVar1;
  char *pcVar2;
  string local_30;
  
  if (tagTy == (TagType *)0x0) {
    pcVar2 = "<TagType is null>";
    lVar1 = 0x11;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"<TagType | ",0xb);
    operator<<(os,(TagTypeKind)
                  ((ushort)*(undefined2 *)
                            &((tagTy->super_Type).impl_._M_t.
                              super___uniq_ptr_impl<psy::C::Type::TypeImpl,_std::default_delete<psy::C::Type::TypeImpl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_psy::C::Type::TypeImpl_*,_std::default_delete<psy::C::Type::TypeImpl>_>
                              .super__Head_base<0UL,_psy::C::Type::TypeImpl_*,_false>._M_head_impl)
                             ->field_0 >> 0xb) & (Enum|Union));
    std::__ostream_insert<char,std::char_traits<char>>(os," tag:",5);
    Lexeme::valueText_abi_cxx11_
              (&local_30,
               *(Lexeme **)
                ((tagTy->super_Type).impl_._M_t.
                 super___uniq_ptr_impl<psy::C::Type::TypeImpl,_std::default_delete<psy::C::Type::TypeImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_psy::C::Type::TypeImpl_*,_std::default_delete<psy::C::Type::TypeImpl>_>
                 .super__Head_base<0UL,_psy::C::Type::TypeImpl_*,_false>._M_head_impl + 2));
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_30._M_dataplus._M_p,local_30._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = ">";
    lVar1 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

PSY_C_API std::ostream& operator<<(std::ostream& os, const TagType* tagTy)
{
    if (!tagTy)
        return os << "<TagType is null>";
    os << "<TagType | ";
    os << tagTy->kind();
    os << " tag:" << tagTy->tag()->valueText();
    os << ">";
    return os;
}